

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmedian.hpp
# Opt level: O3

vector<Param,_std::allocator<Param>_> * __thiscall
TMedian::Params(vector<Param,_std::allocator<Param>_> *__return_storage_ptr__,TMedian *this)

{
  long lVar1;
  undefined **ppuVar2;
  Param *pPVar3;
  initializer_list<Param> __l;
  allocator_type local_69;
  Param local_68 [6];
  
  ppuVar2 = &PTR_anon_var_dwarf_3a25_00114a50;
  pPVar3 = local_68;
  for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
    pPVar3->Name = *ppuVar2;
    ppuVar2 = ppuVar2 + 1;
    pPVar3 = (Param *)&pPVar3->Type;
  }
  __l._M_len = 6;
  __l._M_array = local_68;
  std::vector<Param,_std::allocator<Param>_>::vector(__return_storage_ptr__,__l,&local_69);
  return __return_storage_ptr__;
}

Assistant:

const std::vector<Param> Params() const override {
    return std::vector<Param> {
      Param {"clip", Clip, false, true, true, false},
      Param {"radius", Integer},
      Param {"planes", Integer, true},
      Param {"y", Integer, false, true, false},
      Param {"u", Integer, false, true, false},
      Param {"v", Integer, false, true, false}
    };
  }